

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlElementPtr xmlGetDtdElementDesc(xmlDtdPtr dtd,xmlChar *name)

{
  xmlHashTablePtr hash;
  xmlChar *key;
  xmlElementPtr pxVar1;
  xmlChar *prefix;
  xmlChar *local_10;
  
  if (((dtd != (xmlDtdPtr)0x0) &&
      (hash = (xmlHashTablePtr)dtd->elements, name != (xmlChar *)0x0 && hash != (xmlHashTablePtr)0x0
      )) && (key = xmlSplitQName4(name,&local_10), key != (xmlChar *)0x0)) {
    pxVar1 = (xmlElementPtr)xmlHashLookup2(hash,key,local_10);
    if (local_10 == (xmlChar *)0x0) {
      return pxVar1;
    }
    (*xmlFree)(local_10);
    return pxVar1;
  }
  return (xmlElementPtr)0x0;
}

Assistant:

xmlElementPtr
xmlGetDtdElementDesc(xmlDtdPtr dtd, const xmlChar *name) {
    xmlElementTablePtr table;
    xmlElementPtr cur;
    const xmlChar *localname;
    xmlChar *prefix;

    if ((dtd == NULL) || (dtd->elements == NULL) ||
        (name == NULL))
        return(NULL);

    table = (xmlElementTablePtr) dtd->elements;
    if (table == NULL)
	return(NULL);

    localname = xmlSplitQName4(name, &prefix);
    if (localname == NULL)
        return(NULL);
    cur = xmlHashLookup2(table, localname, prefix);
    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);
}